

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::bitmapFromData
               (unsigned_short *data,int nData,uchar *bitmap,unsigned_short *minNonZero,
               unsigned_short *maxNonZero)

{
  int i;
  ulong uVar1;
  
  memset(bitmap,0,0x2000);
  if (0 < nData) {
    uVar1 = 0;
    do {
      bitmap[data[uVar1] >> 3] = bitmap[data[uVar1] >> 3] | (byte)(1 << ((byte)data[uVar1] & 7));
      uVar1 = uVar1 + 1;
    } while ((uint)nData != uVar1);
  }
  *bitmap = *bitmap & 0xfe;
  *minNonZero = 0x1fff;
  *maxNonZero = 0;
  uVar1 = 0;
  do {
    if (bitmap[uVar1] != '\0') {
      if (uVar1 < *minNonZero) {
        *minNonZero = (unsigned_short)uVar1;
      }
      if (*maxNonZero < uVar1) {
        *maxNonZero = (unsigned_short)uVar1;
      }
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x2000);
  return;
}

Assistant:

void bitmapFromData(const unsigned short data[/*nData*/], int nData,
                    unsigned char bitmap[BITMAP_SIZE],
                    unsigned short &minNonZero, unsigned short &maxNonZero) {
  for (int i = 0; i < BITMAP_SIZE; ++i) bitmap[i] = 0;

  for (int i = 0; i < nData; ++i) bitmap[data[i] >> 3] |= (1 << (data[i] & 7));

  bitmap[0] &= ~1;  // zero is not explicitly stored in
                    // the bitmap; we assume that the
                    // data always contain zeroes
  minNonZero = BITMAP_SIZE - 1;
  maxNonZero = 0;

  for (int i = 0; i < BITMAP_SIZE; ++i) {
    if (bitmap[i]) {
      if (minNonZero > i) minNonZero = i;
      if (maxNonZero < i) maxNonZero = i;
    }
  }
}